

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Status leveldb::BuildTable(string *dbname,Env *env,Options *options,TableCache *table_cache,
                          Iterator *iter,FileMetaData *meta)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  Slice *pSVar4;
  uint64_t uVar5;
  Iterator *pIVar6;
  long *in_RDX;
  char *in_RDI;
  long *in_R9;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  long in_stack_00000008;
  Iterator *it;
  TableBuilder *builder;
  Status *s;
  Slice key;
  WritableFile *file;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Iterator *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  InternalKey *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  Options *in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  Table **tableptr;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  Slice *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  TableBuilder *in_stack_fffffffffffffe98;
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  Table *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  long *local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Status::Status((Status *)in_stack_fffffffffffffe18);
  *(undefined8 *)(in_stack_00000008 + 0x10) = 0;
  (**(code **)(*in_R9 + 0x18))();
  TableFileName(in_stack_fffffffffffffe30,(uint64_t)in_stack_fffffffffffffe28);
  bVar1 = (**(code **)(*in_R9 + 0x10))();
  if ((bVar1 & 1) != 0) {
    (**(code **)(*in_RDX + 0x20))(local_38,in_RDX,local_28,&local_30);
    Status::operator=((Status *)in_stack_fffffffffffffe28,
                      (Status *)
                      CONCAT17(in_stack_fffffffffffffe27,
                               CONCAT16(in_stack_fffffffffffffe26,
                                        CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20
                                                ))));
    Status::~Status((Status *)in_stack_fffffffffffffe18);
    bVar3 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if (!bVar3) goto LAB_00d5f6d5;
    pSVar4 = (Slice *)operator_new(8);
    TableBuilder::TableBuilder
              ((TableBuilder *)
               CONCAT17(in_stack_fffffffffffffe5f,
                        CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)),
               in_stack_fffffffffffffe50,
               (WritableFile *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    local_48 = (**(code **)(*in_R9 + 0x40))();
    InternalKey::DecodeFrom(in_stack_fffffffffffffe38,(Slice *)in_stack_fffffffffffffe30);
    auVar7._8_8_ = in_stack_fffffffffffffe88;
    auVar7._0_8_ = in_stack_fffffffffffffe90;
    while( true ) {
      bVar1 = (**(code **)(*in_R9 + 0x10))();
      if ((bVar1 & 1) == 0) break;
      auVar7 = (**(code **)(*in_R9 + 0x40))();
      in_stack_fffffffffffffe98 = auVar7._8_8_;
      local_58 = auVar7;
      InternalKey::DecodeFrom(in_stack_fffffffffffffe38,(Slice *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe80 = pSVar4;
      auVar7 = (**(code **)(*in_R9 + 0x48))();
      local_68 = auVar7;
      TableBuilder::Add(auVar7._8_8_,in_stack_fffffffffffffe80,
                        (Slice *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      (**(code **)(*in_R9 + 0x30))();
    }
    TableBuilder::Finish(in_stack_fffffffffffffe98);
    tableptr = &local_70;
    Status::operator=((Status *)in_stack_fffffffffffffe28,
                      (Status *)
                      CONCAT17(in_stack_fffffffffffffe27,
                               CONCAT16(in_stack_fffffffffffffe26,
                                        CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20
                                                ))));
    Status::~Status((Status *)in_stack_fffffffffffffe18);
    uVar2 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if ((bool)uVar2) {
      uVar5 = TableBuilder::FileSize((TableBuilder *)in_stack_fffffffffffffe18);
      *(uint64_t *)(in_stack_00000008 + 0x10) = uVar5;
      if (*(long *)(in_stack_00000008 + 0x10) == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
    }
    if (pSVar4 != (Slice *)0x0) {
      TableBuilder::~TableBuilder((TableBuilder *)in_stack_fffffffffffffe28);
      operator_delete(pSVar4,8);
    }
    bVar3 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if (bVar3) {
      (**(code **)(*local_30 + 0x28))(local_78);
      Status::operator=((Status *)in_stack_fffffffffffffe28,
                        (Status *)
                        CONCAT17(in_stack_fffffffffffffe27,
                                 CONCAT16(in_stack_fffffffffffffe26,
                                          CONCAT15(in_stack_fffffffffffffe25,
                                                   in_stack_fffffffffffffe20))));
      Status::~Status((Status *)in_stack_fffffffffffffe18);
    }
    bVar3 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if (bVar3) {
      (**(code **)(*local_30 + 0x18))(local_80);
      Status::operator=((Status *)in_stack_fffffffffffffe28,
                        (Status *)
                        CONCAT17(in_stack_fffffffffffffe27,
                                 CONCAT16(in_stack_fffffffffffffe26,
                                          CONCAT15(in_stack_fffffffffffffe25,
                                                   in_stack_fffffffffffffe20))));
      Status::~Status((Status *)in_stack_fffffffffffffe18);
    }
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
    local_30 = (long *)0x0;
    bVar3 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if (bVar3) {
      local_98 = 0;
      uStack_90 = 0;
      ReadOptions::ReadOptions((ReadOptions *)in_stack_fffffffffffffe18);
      pIVar6 = TableCache::NewIterator
                         (auVar7._0_8_,auVar7._8_8_,(uint64_t)in_stack_fffffffffffffe80,
                          CONCAT17(uVar2,in_stack_fffffffffffffe78),tableptr);
      (*pIVar6->_vptr_Iterator[10])(local_a0);
      Status::operator=((Status *)in_stack_fffffffffffffe28,
                        (Status *)
                        CONCAT17(in_stack_fffffffffffffe27,
                                 CONCAT16(in_stack_fffffffffffffe26,
                                          CONCAT15(in_stack_fffffffffffffe25,
                                                   in_stack_fffffffffffffe20))));
      Status::~Status((Status *)in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe28 = pIVar6;
      if (pIVar6 != (Iterator *)0x0) {
        (*pIVar6->_vptr_Iterator[1])();
        in_stack_fffffffffffffe28 = pIVar6;
      }
    }
  }
  (**(code **)(*in_R9 + 0x50))(local_a8);
  uVar2 = Status::ok((Status *)in_stack_fffffffffffffe18);
  bVar1 = uVar2 ^ 0xff;
  Status::~Status((Status *)in_stack_fffffffffffffe18);
  if ((bVar1 & 1) != 0) {
    (**(code **)(*in_R9 + 0x50))(local_b0);
    Status::operator=((Status *)in_stack_fffffffffffffe28,
                      (Status *)
                      CONCAT17(uVar2,CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffe25,
                                                             in_stack_fffffffffffffe20))));
    Status::~Status((Status *)in_stack_fffffffffffffe18);
  }
  bVar3 = Status::ok((Status *)in_stack_fffffffffffffe18);
  if ((!bVar3) || (*(long *)(in_stack_00000008 + 0x10) == 0)) {
    (**(code **)(*in_RDX + 0x40))(local_b8,in_RDX,local_28);
    Status::~Status((Status *)in_stack_fffffffffffffe18);
  }
LAB_00d5f6d5:
  std::__cxx11::string::~string(in_stack_fffffffffffffe18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}